

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

int shellDeleteFile(char *zFilename)

{
  int iVar1;
  
  iVar1 = unlink(zFilename);
  return iVar1;
}

Assistant:

int shellDeleteFile(const char *zFilename) {
	int rc;
#ifdef _WIN32
	wchar_t *z = sqlite3_win32_utf8_to_unicode(zFilename);
	rc = _wunlink(z);
	sqlite3_free(z);
#else
	rc = unlink(zFilename);
#endif
	return rc;
}